

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

ssize_t __thiscall Instance::read(Instance *this,int __fd,void *__buf,size_t __nbytes)

{
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_00;
  Item *this_01;
  pointer *ppcVar1;
  pointer piVar2;
  pointer pcVar3;
  iterator iVar4;
  pointer pvVar5;
  bool bVar6;
  short sVar7;
  void *pvVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  runtime_error *this_02;
  pointer pIVar13;
  undefined4 in_register_00000034;
  undefined8 uVar14;
  pointer pvVar15;
  iterator iVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  int *piVar20;
  long lVar21;
  double dVar22;
  int bi;
  char buf [256];
  int ti;
  uint local_29c;
  int local_298;
  int local_294;
  vector<int,_std::allocator<int>_> *local_290;
  pointer local_288;
  undefined8 local_280;
  int local_278;
  allocator_type local_271;
  undefined8 local_270;
  vector<char,_std::allocator<char>_> *local_268;
  int local_260;
  int local_25c;
  int *local_258;
  vector<int,std::allocator<int>> *local_250;
  vector<int,std::allocator<int>> *local_248;
  vector<Item,_std::allocator<Item>_> *local_240;
  Item local_238 [3];
  int local_138 [66];
  
  uVar14 = CONCAT44(in_register_00000034,__fd);
  iVar9 = __isoc99_fscanf(uVar14," #INSTANCE_BEGIN#");
  if (iVar9 == 0) {
    iVar9 = __isoc99_fscanf(uVar14," $INSTANCE {");
    if (iVar9 == 0) {
      iVar9 = __isoc99_fscanf(uVar14,"%d",this);
      if (iVar9 == 1) {
        local_294 = (int)__buf;
        if (this->ndims < 1) {
          snprintf((char *)local_238,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d"
                   ,"ndims >= 1",
                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                   ,0x6e);
          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_02,(char *)local_238);
        }
        else {
          piVar20 = &this->nbtypes;
          if (local_294 == 1) {
            iVar9 = __isoc99_fscanf(uVar14,"%d",piVar20);
            if (iVar9 != 1) {
              snprintf((char *)local_238,0x100,
                       "AssertionError: assertion `%s` failed in \"%s\" line %d",
                       "fscanf(fin, \"%d\", &nbtypes) == 1",
                       "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                       ,0x71);
              this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_02,(char *)local_238);
              goto LAB_00104414;
            }
            if (*piVar20 < 1) {
              snprintf((char *)local_238,0x100,
                       "AssertionError: assertion `%s` failed in \"%s\" line %d","nbtypes >= 1",
                       "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                       ,0x72);
              this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_02,(char *)local_238);
              goto LAB_00104414;
            }
          }
          else {
            *piVar20 = 1;
          }
          this_00 = &this->Ws;
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::resize(this_00,(long)this->nbtypes);
          local_288 = (pointer)&this->Cs;
          std::vector<int,_std::allocator<int>_>::resize
                    ((vector<int,_std::allocator<int>_> *)local_288,(long)this->nbtypes);
          local_290 = &this->Qs;
          std::vector<int,_std::allocator<int>_>::resize(local_290,(long)this->nbtypes);
          local_270 = uVar14;
          if (0 < this->nbtypes) {
            piVar20 = (int *)0x0;
            do {
              local_280 = piVar20;
              std::vector<int,_std::allocator<int>_>::resize
                        ((this->Ws).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (long)piVar20,(long)this->ndims
                        );
              if (0 < this->ndims) {
                lVar19 = 0;
                lVar21 = 0;
                do {
                  iVar9 = __isoc99_fscanf(local_270,"%d",
                                          *(long *)&(this_00->
                                                                                                        
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [(long)piVar20].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + lVar19);
                  if (iVar9 != 1) {
                    snprintf((char *)local_238,0x100,
                             "AssertionError: assertion `%s` failed in \"%s\" line %d",
                             "fscanf(fin, \"%d\", &Ws[t][d]) == 1",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                             ,0x7d);
                    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_02,(char *)local_238);
                    goto LAB_00104414;
                  }
                  if (*(int *)(*(long *)&(this_00->
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start[(long)piVar20].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data + lVar19) < 0) {
                    snprintf((char *)local_238,0x100,
                             "AssertionError: assertion `%s` failed in \"%s\" line %d",
                             "Ws[t][d] >= 0",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                             ,0x7e);
                    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_02,(char *)local_238);
                    goto LAB_00104414;
                  }
                  lVar21 = lVar21 + 1;
                  lVar19 = lVar19 + 4;
                } while (lVar21 < this->ndims);
              }
              uVar14 = local_270;
              piVar20 = local_280;
              if (local_294 == 1) {
                iVar9 = __isoc99_fscanf(local_270,"%d");
                if (iVar9 != 1) {
                  snprintf((char *)local_238,0x100,
                           "AssertionError: assertion `%s` failed in \"%s\" line %d",
                           "fscanf(fin, \"%d\", &Cs[t]) == 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                           ,0x81);
                  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this_02,(char *)local_238);
                  goto LAB_00104414;
                }
                iVar9 = __isoc99_fscanf(uVar14,"%d",
                                        (local_290->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_start + (long)piVar20);
                if (iVar9 != 1) {
                  snprintf((char *)local_238,0x100,
                           "AssertionError: assertion `%s` failed in \"%s\" line %d",
                           "fscanf(fin, \"%d\", &Qs[t]) == 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                           ,0x82);
                  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this_02,(char *)local_238);
                  goto LAB_00104414;
                }
              }
              else {
                (local_288->w).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)local_280] = 1;
                (local_290->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[(long)local_280] = -1;
              }
              piVar20 = (int *)((long)piVar20 + 1);
            } while ((long)piVar20 < (long)this->nbtypes);
          }
          local_240 = &this->items;
          std::vector<Item,_std::allocator<Item>_>::_M_erase_at_end
                    (local_240,
                     (this->items).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                     super__Vector_impl_data._M_start);
          piVar2 = (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish != piVar2) {
            (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar2;
          }
          pcVar3 = (this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish != pcVar3) {
            (this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = pcVar3;
          }
          piVar2 = (this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish != piVar2) {
            (this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar2;
          }
          piVar20 = &this->m;
          iVar9 = __isoc99_fscanf(uVar14,"%d",piVar20);
          if (iVar9 == 1) {
            local_268 = &this->ctypes;
            local_250 = (vector<int,std::allocator<int>> *)&this->demands;
            local_258 = piVar20;
            if (0 < *piVar20) {
              local_248 = (vector<int,std::allocator<int>> *)&this->nopts;
              local_278 = 0;
              iVar9 = 0;
              iVar11 = local_294;
              do {
                if (iVar11 == 1) {
                  iVar10 = __isoc99_fscanf(uVar14,"%d",local_138);
                  if (iVar10 != 1) {
                    snprintf((char *)local_238,0x100,
                             "AssertionError: assertion `%s` failed in \"%s\" line %d",
                             "fscanf(fin, \"%d\", &ti) == 1",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                             ,0x92);
                    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_02,(char *)local_238);
                    goto LAB_00104414;
                  }
                  if (local_138[0] < 0) {
                    snprintf((char *)local_238,0x100,
                             "AssertionError: assertion `%s` failed in \"%s\" line %d","ti >= 0",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                             ,0x93);
                    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_02,(char *)local_238);
                    goto LAB_00104414;
                  }
                  iVar10 = __isoc99_fscanf(uVar14,"%d",&local_29c);
                  if (iVar10 != 1) {
                    snprintf((char *)local_238,0x100,
                             "AssertionError: assertion `%s` failed in \"%s\" line %d",
                             "fscanf(fin, \"%d\", &bi) == 1",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                             ,0x94);
                    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_02,(char *)local_238);
                    goto LAB_00104414;
                  }
                  if ((int)local_29c < 0) {
                    snprintf((char *)local_238,0x100,
                             "AssertionError: assertion `%s` failed in \"%s\" line %d","bi >= 0",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                             ,0x95);
                    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_02,(char *)local_238);
                    goto LAB_00104414;
                  }
                  iVar4._M_current =
                       (this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar4._M_current ==
                      (this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              (local_250,iVar4,(int *)&local_29c);
                  }
                  else {
                    *iVar4._M_current = local_29c;
                    (this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
                  }
                }
                else {
                  local_138[0] = 1;
                  local_29c = 0xffffffff;
                }
                iVar4._M_current =
                     (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar4._M_current ==
                    (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (local_248,iVar4,local_138);
                }
                else {
                  *iVar4._M_current = local_138[0];
                  (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar4._M_current + 1;
                }
                local_238[0].w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start._0_1_ = '*';
                iVar16._M_current =
                     (this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar16._M_current ==
                    (this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                            (local_268,iVar16,(char *)local_238);
                }
                else {
                  *iVar16._M_current = '*';
                  ppcVar1 = &(this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish;
                  *ppcVar1 = *ppcVar1 + 1;
                }
                local_290 = (vector<int,_std::allocator<int>_> *)
                            ((ulong)local_290 & 0xffffffff00000000);
                if (0 < local_138[0]) {
                  local_260 = 0;
                  do {
                    Item::Item(local_238,this->ndims);
                    std::vector<Item,_std::allocator<Item>_>::emplace_back<Item>
                              (local_240,local_238);
                    if (local_238[0].nonzero.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_238[0].nonzero.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
                    }
                    pvVar8 = (void *)CONCAT17(local_238[0].w.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start._7_1_,
                                              CONCAT16(local_238[0].w.
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_start.
                                                       _6_1_,CONCAT24(local_238[0].w.
                                                                                                                                            
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_2_,
                                                  CONCAT13(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._3_1_,
                                                  CONCAT12(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._2_1_,
                                                  CONCAT11(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (char)local_238[0].w.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start))))));
                    local_25c = iVar9;
                    if (pvVar8 != (void *)0x0) {
                      operator_delete(pvVar8);
                    }
                    local_288 = (this->items).super__Vector_base<Item,_std::allocator<Item>_>.
                                _M_impl.super__Vector_impl_data._M_finish;
                    this_01 = local_288 + -1;
                    iVar9 = -1;
                    if (1 < local_138[0]) {
                      iVar9 = (int)local_290;
                    }
                    local_288[-1].opt = iVar9;
                    local_298 = 0;
                    if (0 < this->ndims) {
                      pIVar13 = local_288 + -1;
                      do {
                        piVar20 = Item::operator[](this_01,local_298);
                        iVar9 = __isoc99_fscanf(uVar14,"%d",piVar20);
                        if (iVar9 != 1) {
                          snprintf((char *)local_238,0x100,
                                   "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                   "fscanf(fin, \"%d\", &item[d]) == 1",
                                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                                   ,0xa9);
                          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this_02,(char *)local_238);
                          goto LAB_00104414;
                        }
                        piVar20 = Item::operator[](this_01,local_298);
                        if (*piVar20 < 0) {
                          snprintf((char *)local_238,0x100,
                                   "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                   "item[d] >= 0",
                                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                                   ,0xaa);
                          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this_02,(char *)local_238);
                          goto LAB_00104414;
                        }
                        piVar20 = Item::operator[](this_01,local_298);
                        if (*piVar20 != 0) {
                          iVar4._M_current =
                               local_288[-1].nonzero.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                          if (iVar4._M_current ==
                              local_288[-1].nonzero.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage) {
                            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                      ((vector<int,std::allocator<int>> *)&pIVar13->nonzero,iVar4,
                                       &local_298);
                          }
                          else {
                            *iVar4._M_current = local_298;
                            local_288[-1].nonzero.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
                          }
                        }
                        local_298 = local_298 + 1;
                      } while (local_298 < this->ndims);
                    }
                    pIVar13 = local_288;
                    if (local_288[-1].nonzero.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start ==
                        local_288[-1].nonzero.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
                      snprintf((char *)local_238,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "!item.nonzero.empty()",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0xaf);
                      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_02,(char *)local_238);
                      goto LAB_00104414;
                    }
                    if (iVar11 == 0) {
                      iVar9 = __isoc99_fscanf(uVar14,"%d",&local_29c);
                      if (iVar9 != 1) {
                        snprintf((char *)local_238,0x100,
                                 "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                 "fscanf(fin, \"%d\", &bi) == 1",
                                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                                 ,0xb2);
                        this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(this_02,(char *)local_238);
                        goto LAB_00104414;
                      }
                      if ((int)local_29c < 0) {
                        snprintf((char *)local_238,0x100,
                                 "AssertionError: assertion `%s` failed in \"%s\" line %d","bi >= 0"
                                 ,
                                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                                 ,0xb3);
                        this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(this_02,(char *)local_238);
                        goto LAB_00104414;
                      }
                      iVar4._M_current =
                           (this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                      if (iVar4._M_current ==
                          (this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                  (local_250,iVar4,(int *)&local_29c);
                      }
                      else {
                        *iVar4._M_current = local_29c;
                        (this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
                      }
                    }
                    pIVar13[-1].demand = local_29c;
                    local_298 = 0;
                    std::vector<int,_std::allocator<int>_>::vector
                              (&local_238[0].w,(long)this->ndims,&local_298,&local_271);
                    if (0 < this->ndims) {
                      lVar19 = CONCAT17(local_238[0].w.super__Vector_base<int,_std::allocator<int>_>
                                        ._M_impl.super__Vector_impl_data._M_start._7_1_,
                                        CONCAT16(local_238[0].w.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start._6_1_,
                                                 CONCAT24(local_238[0].w.
                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_2_,
                                                  CONCAT13(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._3_1_,
                                                  CONCAT12(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._2_1_,
                                                  CONCAT11(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (char)local_238[0].w.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start))))));
                      pvVar5 = (this_00->
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                      lVar21 = 0;
                      do {
                        if (0 < this->nbtypes) {
                          lVar18 = 0;
                          pvVar15 = pvVar5;
                          do {
                            iVar9 = *(int *)(lVar19 + lVar21 * 4);
                            iVar10 = *(int *)(*(long *)&(pvVar15->
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data + lVar21 * 4);
                            if (iVar10 < iVar9) {
                              iVar10 = iVar9;
                            }
                            *(int *)(lVar19 + lVar21 * 4) = iVar10;
                            lVar18 = lVar18 + 1;
                            pvVar15 = pvVar15 + 1;
                          } while (lVar18 < this->nbtypes);
                        }
                        lVar21 = lVar21 + 1;
                      } while (lVar21 < this->ndims);
                    }
                    if (this->ndims < 1) {
                      local_280 = (int *)((ulong)local_280._4_4_ << 0x20);
                    }
                    else {
                      lVar19 = 0;
                      local_280 = (int *)((ulong)local_280._4_4_ << 0x20);
                      do {
                        if (0 < *(int *)(CONCAT17(local_238[0].w.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._7_1_,
                                                  CONCAT16(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._6_1_,
                                                  CONCAT24(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_2_,
                                                  CONCAT13(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._3_1_,
                                                  CONCAT12(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._2_1_,
                                                  CONCAT11(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (char)local_238[0].w.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start)))))) +
                                        lVar19 * 4)) {
                          piVar20 = Item::operator[](this_01,(int)lVar19);
                          dVar22 = round(((double)*piVar20 /
                                         (double)*(int *)(CONCAT17(local_238[0].w.
                                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._7_1_,
                                                  CONCAT16(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._6_1_,
                                                  CONCAT24(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_2_,
                                                  CONCAT13(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._3_1_,
                                                  CONCAT12(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._2_1_,
                                                  CONCAT11(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (char)local_238[0].w.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start)))))) +
                                                  lVar19 * 4)) * 10000.0);
                          local_280 = (int *)CONCAT44(local_280._4_4_,
                                                      (int)((double)(int)local_280 + dVar22));
                        }
                        lVar19 = lVar19 + 1;
                      } while (lVar19 < this->ndims);
                    }
                    pIVar13 = local_288;
                    if (0 < local_288[-1].demand) {
                      if (this->nbtypes < 1) {
                        uVar12 = 0;
                      }
                      else {
                        lVar19 = 0;
                        do {
                          bVar6 = true;
                          if (0 < this->ndims) {
                            lVar21 = 0;
                            do {
                              piVar20 = Item::operator[](this_01,(int)lVar21);
                              pIVar13 = local_288;
                              if (*(int *)(*(long *)&(this_00->
                                                                                                          
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[lVar19]
                                                  .super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + lVar21 * 4) <
                                  *piVar20) {
                                bVar6 = false;
                                break;
                              }
                              lVar21 = lVar21 + 1;
                            } while (lVar21 < this->ndims);
                          }
                        } while ((!bVar6) && (lVar19 = lVar19 + 1, lVar19 < this->nbtypes));
                        uVar12 = (uint)bVar6;
                        uVar14 = local_270;
                        iVar11 = local_294;
                      }
                      local_260 = local_260 + uVar12;
                    }
                    iVar9 = local_25c;
                    pIVar13[-1].key = (int)local_280;
                    pIVar13[-1].type = local_278;
                    pIVar13[-1].id = local_25c;
                    pvVar8 = (void *)CONCAT17(local_238[0].w.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start._7_1_,
                                              CONCAT16(local_238[0].w.
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_start.
                                                       _6_1_,CONCAT24(local_238[0].w.
                                                                                                                                            
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_2_,
                                                  CONCAT13(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._3_1_,
                                                  CONCAT12(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._2_1_,
                                                  CONCAT11(local_238[0].w.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (char)local_238[0].w.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start))))));
                    if (pvVar8 != (void *)0x0) {
                      operator_delete(pvVar8);
                    }
                    iVar9 = iVar9 + 1;
                    iVar10 = (int)local_290 + 1;
                    local_290 = (vector<int,_std::allocator<int>_> *)
                                CONCAT44(local_290._4_4_,iVar10);
                  } while (iVar10 < local_138[0]);
                  local_290 = (vector<int,_std::allocator<int>_> *)
                              CONCAT44(local_290._4_4_,
                                       CONCAT31((int3)((uint)iVar10 >> 8),0 < local_260));
                }
                if ((0 < (int)local_29c) && ((char)local_290 == '\0')) {
                  snprintf((char *)local_238,0x100,
                           "AssertionError: assertion `%s` failed in \"%s\" line %d","nfits >= 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                           ,0xda);
                  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this_02,(char *)local_238);
                  goto LAB_00104414;
                }
                local_278 = local_278 + 1;
              } while (local_278 < *local_258);
            }
            iVar9 = __isoc99_fscanf(uVar14," } ;");
            if (iVar9 < 1) {
              iVar9 = __isoc99_fscanf(uVar14," $%[^{ \n]",local_238);
              if (iVar9 == 1) {
                local_280 = &this->method;
                do {
                  piVar20 = local_280;
                  if (local_238[0].w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start._4_2_ == 0x45 &&
                      CONCAT13(local_238[0].w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._3_1_,
                               CONCAT12(local_238[0].w.super__Vector_base<int,_std::allocator<int>_>
                                        ._M_impl.super__Vector_impl_data._M_start._2_1_,
                                        CONCAT11(local_238[0].w.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start._1_1_,
                                                 (char)local_238[0].w.
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_start)))
                      == 0x50595456) {
                    iVar9 = __isoc99_fscanf(uVar14," { %[^}, \n] } ;",local_238);
                    if (iVar9 != 1) {
                      snprintf((char *)local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "fscanf(fin, \" { %[^}, \\n] } ;\", buf) == 1",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0xe2);
                      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_02,(char *)local_138);
                      goto LAB_00104414;
                    }
                    this->vtype = (char)local_238[0].w.super__Vector_base<int,_std::allocator<int>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                    if (((char)local_238[0].w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start != 'C') &&
                       ((char)local_238[0].w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start != 'I')) {
                      snprintf((char *)local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "vtype == \'C\' || vtype == \'I\'",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0xe4);
                      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_02,(char *)local_138);
                      goto LAB_00104414;
                    }
                  }
                  else if (local_238[0].w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_2_ == 0x45 &&
                           CONCAT13(local_238[0].w.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._3_1_,
                                    CONCAT12(local_238[0].w.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start._2_1_,
                                             CONCAT11(local_238[0].w.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start._1_1_
                                                      ,(char)local_238[0].w.
                                                                                                                          
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start))) ==
                           0x50595443) {
                    iVar9 = __isoc99_fscanf(uVar14," {");
                    if (iVar9 != 0) {
                      snprintf((char *)local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "fscanf(fin, \" {\") == 0",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0xe6);
                      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_02,(char *)local_138);
                      goto LAB_00104414;
                    }
                    pcVar3 = (this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    if ((this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish != pcVar3) {
                      (this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish = pcVar3;
                    }
                    if (0 < *local_258) {
                      iVar9 = 0;
                      do {
                        uVar14 = local_270;
                        if ((iVar9 != 0) && (iVar11 = __isoc99_fscanf(local_270," ,"), iVar11 != 0))
                        {
                          snprintf((char *)local_138,0x100,
                                   "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                   "fscanf(fin, \" ,\") == 0",
                                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                                   ,0xe9);
                          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this_02,(char *)local_138);
                          goto LAB_00104414;
                        }
                        iVar11 = __isoc99_fscanf(uVar14," %[^}, \n]",local_238);
                        if (iVar11 != 1) {
                          snprintf((char *)local_138,0x100,
                                   "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                   "fscanf(fin, \" %[^}, \\n]\", buf) == 1",
                                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                                   ,0xea);
                          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this_02,(char *)local_138);
                          goto LAB_00104414;
                        }
                        sVar7 = CONCAT11(local_238[0].w.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start._1_1_,
                                         (char)local_238[0].w.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start);
                        if (sVar7 == 0x2a) {
                          local_138[0] = CONCAT31(local_138[0]._1_3_,0x2a);
                          iVar16._M_current =
                               (this->ctypes).super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                          if (iVar16._M_current !=
                              (this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage) {
                            *iVar16._M_current = '*';
                            goto LAB_00104212;
                          }
LAB_0010421b:
                          std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                                    (local_268,iVar16,(char *)local_138);
                        }
                        else {
                          if (sVar7 == 0x3d) {
                            local_138[0] = CONCAT31(local_138[0]._1_3_,0x3d);
                            iVar16._M_current =
                                 (this->ctypes).super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish;
                            if (iVar16._M_current ==
                                (this->ctypes).super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage)
                            goto LAB_0010421b;
                            *iVar16._M_current = '=';
                          }
                          else {
                            if (sVar7 != 0x3e) {
                              snprintf((char *)local_138,0x100,
                                       "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                       "!strcmp(buf, \"*\")",
                                       "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                                       ,0xf0);
                              this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error(this_02,(char *)local_138);
                              goto LAB_00104414;
                            }
                            local_138[0] = CONCAT31(local_138[0]._1_3_,0x3e);
                            iVar16._M_current =
                                 (this->ctypes).super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish;
                            if (iVar16._M_current ==
                                (this->ctypes).super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage)
                            goto LAB_0010421b;
                            *iVar16._M_current = '>';
                          }
LAB_00104212:
                          ppcVar1 = &(this->ctypes).super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_finish;
                          *ppcVar1 = *ppcVar1 + 1;
                        }
                        iVar9 = iVar9 + 1;
                      } while (iVar9 < *local_258);
                    }
                    uVar14 = local_270;
                    iVar9 = __isoc99_fscanf(local_270," } ;");
                    if (iVar9 != 0) {
                      snprintf((char *)local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "fscanf(fin, \" } ;\") == 0",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0xf4);
                      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_02,(char *)local_138);
                      goto LAB_00104414;
                    }
                  }
                  else if (CONCAT13(local_238[0].w.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._6_1_,
                                    CONCAT21(local_238[0].w.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start._4_2_,
                                             local_238[0].w.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start._3_1_)) == 0x444f48 &&
                           CONCAT13(local_238[0].w.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._3_1_,
                                    CONCAT12(local_238[0].w.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start._2_1_,
                                             CONCAT11(local_238[0].w.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start._1_1_
                                                      ,(char)local_238[0].w.
                                                                                                                          
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start))) ==
                           0x4854454d) {
                    iVar9 = __isoc99_fscanf(uVar14," { %d } ;",local_280);
                    if (iVar9 != 1) {
                      snprintf((char *)local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "fscanf(fin, \" { %d } ;\", &method) == 1",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0xf6);
                      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_02,(char *)local_138);
                      goto LAB_00104414;
                    }
                    if (*piVar20 != -3) {
                      snprintf((char *)local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "method >= MIN_METHOD && method <= MAX_METHOD",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0xf7);
                      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_02,(char *)local_138);
                      goto LAB_00104414;
                    }
                  }
                  else if (local_238[0].w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_2_ == 0x58 &&
                           CONCAT13(local_238[0].w.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._3_1_,
                                    CONCAT12(local_238[0].w.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start._2_1_,
                                             CONCAT11(local_238[0].w.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start._1_1_
                                                      ,(char)local_238[0].w.
                                                                                                                          
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start))) ==
                           0x414c4552) {
                    local_29c = 0;
                    iVar9 = __isoc99_fscanf(uVar14," { %d } ;",&local_29c);
                    if (iVar9 != 1) {
                      snprintf((char *)local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "fscanf(fin, \" { %d } ;\", &trelax) == 1",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0xfa);
                      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_02,(char *)local_138);
                      goto LAB_00104414;
                    }
                    if (1 < local_29c) {
                      snprintf((char *)local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "trelax == 0 || trelax == 1",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0xfb);
                      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_02,(char *)local_138);
                      goto LAB_00104414;
                    }
                    this->relax_domains = SUB41(local_29c,0);
                  }
                  else {
                    if (CONCAT13(local_238[0].w.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._6_1_,
                                 CONCAT21(local_238[0].w.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start._4_2_,
                                          local_238[0].w.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start._3_1_)) != 0x595241 ||
                        CONCAT13(local_238[0].w.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._3_1_,
                                 CONCAT12(local_238[0].w.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start._2_1_,
                                          CONCAT11(local_238[0].w.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start._1_1_,
                                                   (char)local_238[0].w.
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start))) !=
                        0x414e4942) {
                      printf("Invalid option \'%s\'!\n",local_238);
                      exit(1);
                    }
                    local_29c = 0;
                    iVar9 = __isoc99_fscanf(uVar14," { %d } ;",&local_29c);
                    if (iVar9 != 1) {
                      snprintf((char *)local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "fscanf(fin, \" { %d } ;\", &tbinary) == 1",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0xff);
                      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_02,(char *)local_138);
                      goto LAB_00104414;
                    }
                    if (1 < local_29c) {
                      snprintf((char *)local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "tbinary == 0 || tbinary == 1",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                               ,0x100);
                      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_02,(char *)local_138);
                      goto LAB_00104414;
                    }
                    this->binary = SUB41(local_29c,0);
                  }
                  iVar9 = __isoc99_fscanf(uVar14," $%[^{ \n]",local_238);
                } while (iVar9 == 1);
              }
              iVar9 = __isoc99_fscanf(uVar14);
              if (iVar9 < 1) {
                uVar12 = *local_258;
                if (0 < (int)uVar12) {
                  lVar19 = 0;
                  do {
                    pcVar3 = (local_268->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                             super__Vector_impl_data._M_start;
                    if (pcVar3[lVar19] == '*') {
                      pcVar3[lVar19] = '>' - (*(int *)(*(long *)local_250 + lVar19 * 4) < 2);
                    }
                    lVar19 = lVar19 + 1;
                    uVar12 = *local_258;
                  } while (lVar19 < (int)uVar12);
                }
                this->n = 0;
                if (0 < (int)uVar12) {
                  iVar9 = this->n;
                  piVar2 = (this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  uVar17 = 0;
                  do {
                    iVar9 = iVar9 + piVar2[uVar17];
                    this->n = iVar9;
                    uVar17 = uVar17 + 1;
                  } while (uVar12 != uVar17);
                }
                uVar12 = (int)((ulong)((long)(this->items).
                                             super__Vector_base<Item,_std::allocator<Item>_>._M_impl
                                             .super__Vector_impl_data._M_finish -
                                      (long)(this->items).
                                            super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                                            super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
                this->nsizes = uVar12;
                return (ulong)uVar12;
              }
              snprintf((char *)local_138,0x100,
                       "AssertionError: assertion `%s` failed in \"%s\" line %d",
                       "fscanf(fin, \" #INSTANCE_END#\") <= 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                       ,0x107);
              this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_02,(char *)local_138);
            }
            else {
              snprintf((char *)local_238,0x100,
                       "AssertionError: assertion `%s` failed in \"%s\" line %d",
                       "fscanf(fin, \" } ;\") <= 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                       ,0xdd);
              this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_02,(char *)local_238);
            }
          }
          else {
            snprintf((char *)local_238,0x100,
                     "AssertionError: assertion `%s` failed in \"%s\" line %d",
                     "fscanf(fin, \"%d\", &m) == 1",
                     "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                     ,0x8e);
            this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_02,(char *)local_238);
          }
        }
      }
      else {
        snprintf((char *)local_238,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                 "fscanf(fin, \"%d\", &ndims) == 1",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                 ,0x6d);
        this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_02,(char *)local_238);
      }
    }
    else {
      snprintf((char *)local_238,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
               "fscanf(fin, \" $INSTANCE {\") == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
               ,0x6c);
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,(char *)local_238);
    }
  }
  else {
    snprintf((char *)local_238,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "fscanf(fin, \" #INSTANCE_BEGIN#\") == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
             ,0x6b);
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,(char *)local_238);
  }
LAB_00104414:
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Instance::read(FILE *fin, ftype type) {
	throw_assert(fscanf(fin, " #INSTANCE_BEGIN#") == 0);
	throw_assert(fscanf(fin, " $INSTANCE {") == 0);
	throw_assert(fscanf(fin, "%d", &ndims) == 1);
	throw_assert(ndims >= 1);

	if (type == MVP) {
		throw_assert(fscanf(fin, "%d", &nbtypes) == 1);
		throw_assert(nbtypes >= 1);
	} else {
		nbtypes = 1;
	}

	Ws.resize(nbtypes);
	Cs.resize(nbtypes);
	Qs.resize(nbtypes);
	for (int t = 0; t < nbtypes; t++) {
		Ws[t].resize(ndims);
		for (int d = 0; d < ndims; d++) {
			throw_assert(fscanf(fin, "%d", &Ws[t][d]) == 1);
			throw_assert(Ws[t][d] >= 0);
		}
		if (type == MVP) {
			throw_assert(fscanf(fin, "%d", &Cs[t]) == 1);
			throw_assert(fscanf(fin, "%d", &Qs[t]) == 1);
		} else {
			Cs[t] = 1;
			Qs[t] = -1;
		}
	}

	items.clear();
	nopts.clear();
	ctypes.clear();
	demands.clear();
	int it_count = 0;
	throw_assert(fscanf(fin, "%d", &m) == 1);
	for (int it_type = 0; it_type < m; it_type++) {
		int ti, bi;
		if (type == MVP) {
			throw_assert(fscanf(fin, "%d", &ti) == 1);
			throw_assert(ti >= 0);
			throw_assert(fscanf(fin, "%d", &bi) == 1);
			throw_assert(bi >= 0);
			demands.push_back(bi);
		} else {
			ti = 1;
			bi = -1;
		}
		nopts.push_back(ti);
		ctypes.push_back('*');

		int nfits = 0;
		for (int opt = 0; opt < ti; opt++) {
			items.push_back(Item(ndims));
			Item &item = items.back();
			if (ti > 1) {
				item.opt = opt;
			} else {
				item.opt = -1;
			}

			for (int d = 0; d < ndims; d++) {
				throw_assert(fscanf(fin, "%d", &item[d]) == 1);
				throw_assert(item[d] >= 0);
				if (item[d] != 0) {
					item.nonzero.push_back(d);
				}
			}
			throw_assert(!item.nonzero.empty());

			if (type == VBP) {
				throw_assert(fscanf(fin, "%d", &bi) == 1);
				throw_assert(bi >= 0);
				demands.push_back(bi);
			}
			item.demand = bi;

			int S = 0;
			std::vector<int> maxW(ndims, 0);
			for (int d = 0; d < ndims; d++) {
				for (int t = 0; t < nbtypes; t++) {
					maxW[d] = std::max(maxW[d], Ws[t][d]);
				}
			}
			for (int d = 0; d < ndims; d++) {
				if (maxW[d] > 0) {
					S += round(
							item[d] / static_cast<double>(maxW[d]) * NORM_PRECISION);
				}
			}
			if (item.demand > 0) {
				bool fits = false;
				for (int t = 0; t < nbtypes; t++) {
					fits = true;
					for (int d = 0; d < ndims; d++) {
						if (item[d] > Ws[t][d]) {
							fits = false;
							break;
						}
					}
					if (fits) {
						break;
					}
				}
				nfits += fits;
			}
			item.key = S;
			item.type = it_type;
			item.id = it_count++;
		}
		if (bi > 0) {
			throw_assert(nfits >= 1);
		}
	}
	throw_assert(fscanf(fin, " } ;") <= 0);

	char buf[MAX_LEN];
	while (fscanf(fin, " $%[^{ \n]", buf) == 1) {
		if (!strcmp(buf, "VTYPE")) {
			throw_assert(fscanf(fin, " { %[^}, \n] } ;", buf) == 1);
			vtype = buf[0];
			throw_assert(vtype == 'C' || vtype == 'I');
		} else if (!strcmp(buf, "CTYPE")) {
			throw_assert(fscanf(fin, " {") == 0);
			ctypes.clear();
			for (int i = 0; i < m; i++) {
				if (i) throw_assert(fscanf(fin, " ,") == 0);
				throw_assert(fscanf(fin, " %[^}, \n]", buf) == 1);
				if (!strcmp(buf, ">")) {
					ctypes.push_back('>');
				} else if (!strcmp(buf, "=")) {
					ctypes.push_back('=');
				} else {
					throw_assert(!strcmp(buf, "*"));
					ctypes.push_back('*');
				}
			}
			throw_assert(fscanf(fin, " } ;") == 0);
		} else if (!strcmp(buf, "METHOD")) {
			throw_assert(fscanf(fin, " { %d } ;", &method) == 1);
			throw_assert(method >= MIN_METHOD && method <= MAX_METHOD);
		} else if (!strcmp(buf, "RELAX")) {
			int trelax = 0;
			throw_assert(fscanf(fin, " { %d } ;", &trelax) == 1);
			throw_assert(trelax == 0 || trelax == 1);
			relax_domains = trelax;
		} else if (!strcmp(buf, "BINARY")) {
			int tbinary = 0;
			throw_assert(fscanf(fin, " { %d } ;", &tbinary) == 1);
			throw_assert(tbinary == 0 || tbinary == 1);
			binary = tbinary;
		} else {
			printf("Invalid option '%s'!\n", buf);
			exit(1);
		}
	}
	throw_assert(fscanf(fin, " #INSTANCE_END#") <= 0);

	for (int i = 0; i < m; i++) {
		if (ctypes[i] == '*') {
			ctypes[i] = (demands[i] <= 1) ? '=' : '>';
		}
	}

	n = 0;
	for (int i = 0; i < m; i++) {
		n += demands[i];
	}

	nsizes = items.size();
}